

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::add_right_plane
          (three_dim_model *this,int *n,int *gain,int *depth,
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
          *lines_map,
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *curve_loops_map,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *plane_surfaces_map,int *base_points_count,int *panel_count,
          vector<int,_std::allocator<int>_> *roof_line_vector,int *prev_cl_count,int *prev_pls_count
          ,int *prev_pnt_count)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  iterator __x;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar8;
  pair<const_int,_int> local_348;
  _Base_ptr local_340;
  undefined1 local_338;
  allocator<int> local_32d;
  int local_32c;
  int local_328;
  int local_324;
  iterator local_320;
  size_type local_318;
  vector<int,_std::allocator<int>_> local_310;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_2f8;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  pair<const_int,_int> local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  allocator<int> local_2ad;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  iterator local_2a0;
  size_type local_298;
  vector<int,_std::allocator<int>_> local_290;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_278;
  _Base_ptr local_258;
  undefined1 local_250;
  pair<const_int,_GEO::line> local_244;
  _Base_ptr local_238;
  undefined1 local_230;
  pair<const_int,_GEO::line> local_224;
  _Base_ptr local_218;
  undefined1 local_210;
  pair<const_int,_GEO::line> local_204;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  pair<const_int,_GEO::line> local_1e4;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  pair<const_int,_GEO::line> local_1c8;
  int local_1bc;
  _Rb_tree_iterator<std::pair<const_int,_int>_> _Stack_1b8;
  int level_deep;
  undefined1 local_1b0;
  pair<const_int,_int> local_1a8;
  _Base_ptr local_1a0;
  undefined1 local_198;
  allocator<int> local_17d;
  int local_17c;
  int local_178;
  int local_174;
  iterator local_170;
  size_type local_168;
  vector<int,_std::allocator<int>_> local_160;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_148;
  _Base_ptr local_128;
  undefined1 local_120;
  pair<const_int,_GEO::line> local_114;
  _Base_ptr local_108;
  undefined1 local_100;
  pair<const_int,_GEO::line> local_f4;
  _Base_ptr local_e8;
  undefined1 local_e0;
  pair<const_int,_GEO::line> local_d8;
  line local_cc;
  line diag;
  line d;
  line c;
  line b;
  line a;
  int corner_cnt;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_98;
  int local_8c;
  iterator iStack_88;
  int plane_surfaces_count;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_80;
  int local_74;
  iterator iStack_70;
  int curve_loop_count;
  _Rb_tree_iterator<std::pair<const_int,_GEO::line>_> local_68;
  int local_5c;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_58;
  int line_count;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *curve_loops_map_local;
  map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  *lines_map_local;
  int *depth_local;
  int *gain_local;
  int *n_local;
  three_dim_model *this_local;
  
  pmStack_58 = curve_loops_map;
  curve_loops_map_local =
       (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        *)lines_map;
  lines_map_local =
       (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_> *)
       depth;
  depth_local = gain;
  gain_local = n;
  n_local = (int *)this;
  iStack_70 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::end(lines_map);
  local_68 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,GEO::line>>>(iStack_70._M_node,1);
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator->(&local_68);
  local_5c = ppVar3->first;
  bVar2 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::empty(pmStack_58);
  if (bVar2) {
    local_74 = *prev_cl_count;
  }
  else {
    iStack_88 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::end(pmStack_58);
    local_80 = std::
               prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                         (iStack_88._M_node,1);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(&local_80);
    local_74 = ppVar4->first;
  }
  bVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                    (plane_surfaces_map);
  if (bVar2) {
    local_8c = *prev_pls_count;
  }
  else {
    __x = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                    (plane_surfaces_map);
    local_98 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>(__x._M_node,1);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_98);
    local_8c = ppVar5->first;
  }
  for (a.start = 0; pmVar1 = curve_loops_map_local, a.start < 6; a.start = a.start + 1) {
    d.end = *gain_local;
    c.start = *(int *)&(lines_map_local->_M_t)._M_impl * *panel_count + 1 +
              *base_points_count + *prev_pnt_count;
    d.start = c.start + *(int *)&(lines_map_local->_M_t)._M_impl;
    local_5c = local_5c + 1;
    c.end = d.start;
    b.start = d.end;
    b.end = c.start;
    std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_d8,&local_5c,&b);
    pVar6 = std::
            map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
            insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)pmVar1,&local_d8);
    pmVar1 = curve_loops_map_local;
    local_e8 = (_Base_ptr)pVar6.first._M_node;
    local_e0 = pVar6.second;
    local_5c = local_5c + 1;
    std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_f4,&local_5c,&c);
    pVar6 = std::
            map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
            insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)pmVar1,&local_f4);
    pmVar1 = curve_loops_map_local;
    local_108 = (_Base_ptr)pVar6.first._M_node;
    local_100 = pVar6.second;
    local_5c = local_5c + 1;
    std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_114,&local_5c,&d);
    pVar6 = std::
            map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
            insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)pmVar1,&local_114);
    pmVar1 = pmStack_58;
    local_128 = (_Base_ptr)pVar6.first._M_node;
    local_120 = pVar6.second;
    local_74 = local_74 + 1;
    local_17c = local_5c + -2;
    local_178 = local_5c + -1;
    local_174 = local_5c;
    local_170 = &local_17c;
    local_168 = 3;
    std::allocator<int>::allocator(&local_17d);
    __l_01._M_len = local_168;
    __l_01._M_array = local_170;
    std::vector<int,_std::allocator<int>_>::vector(&local_160,__l_01,&local_17d);
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
              (&local_148,&local_74,&local_160);
    pVar7 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::insert(pmVar1,&local_148);
    local_1a0 = (_Base_ptr)pVar7.first._M_node;
    local_198 = pVar7.second;
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_148);
    std::vector<int,_std::allocator<int>_>::~vector(&local_160);
    std::allocator<int>::~allocator(&local_17d);
    local_8c = local_8c + 1;
    std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_1a8,&local_8c,&local_74);
    pVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                      (plane_surfaces_map,&local_1a8);
    _Stack_1b8 = pVar8.first._M_node;
    local_1b0 = pVar8.second;
    for (local_1bc = 1; pmVar1 = curve_loops_map_local,
        local_1bc < *(int *)&(lines_map_local->_M_t)._M_impl; local_1bc = local_1bc + 1) {
      b.start = b.end;
      c.start = b.end + 1;
      local_cc.start = c.start + *(int *)&(lines_map_local->_M_t)._M_impl;
      diag.start = local_cc.start + -1;
      diag.end = b.end;
      local_cc.end = b.end;
      local_5c = local_5c + 1;
      d.start = local_cc.start;
      d.end = diag.start;
      c.end = local_cc.start;
      b.end = c.start;
      std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_1c8,&local_5c,&b);
      pVar6 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                        *)pmVar1,&local_1c8);
      pmVar1 = curve_loops_map_local;
      local_1d8 = (_Base_ptr)pVar6.first._M_node;
      local_1d0 = pVar6.second;
      local_5c = local_5c + 1;
      std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_1e4,&local_5c,&c);
      pVar6 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                        *)pmVar1,&local_1e4);
      local_1f8 = (_Base_ptr)pVar6.first._M_node;
      local_1f0 = pVar6.second;
      if (local_1bc == *(int *)&(lines_map_local->_M_t)._M_impl + -1) {
        std::vector<int,_std::allocator<int>_>::push_back(roof_line_vector,&local_5c);
      }
      pmVar1 = curve_loops_map_local;
      local_5c = local_5c + 1;
      std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
                (&local_204,&local_5c,&local_cc);
      pVar6 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                        *)pmVar1,&local_204);
      pmVar1 = curve_loops_map_local;
      local_218 = (_Base_ptr)pVar6.first._M_node;
      local_210 = pVar6.second;
      local_5c = local_5c + 1;
      std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_224,&local_5c,&d);
      pVar6 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                        *)pmVar1,&local_224);
      pmVar1 = curve_loops_map_local;
      local_238 = (_Base_ptr)pVar6.first._M_node;
      local_230 = pVar6.second;
      local_5c = local_5c + 1;
      std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>(&local_244,&local_5c,&diag);
      pVar6 = std::
              map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              ::insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                        *)pmVar1,&local_244);
      pmVar1 = pmStack_58;
      local_258 = (_Base_ptr)pVar6.first._M_node;
      local_250 = pVar6.second;
      local_74 = local_74 + 1;
      local_2ac = local_5c + -4;
      local_2a8 = local_5c + -3;
      local_2a4 = local_5c + -2;
      local_2a0 = &local_2ac;
      local_298 = 3;
      std::allocator<int>::allocator(&local_2ad);
      __l_00._M_len = local_298;
      __l_00._M_array = local_2a0;
      std::vector<int,_std::allocator<int>_>::vector(&local_290,__l_00,&local_2ad);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
                (&local_278,&local_74,&local_290);
      pVar7 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::insert(pmVar1,&local_278);
      local_2c0 = (_Base_ptr)pVar7.first._M_node;
      local_2b8 = pVar7.second;
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_278);
      std::vector<int,_std::allocator<int>_>::~vector(&local_290);
      std::allocator<int>::~allocator(&local_2ad);
      local_8c = local_8c + 1;
      std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_2c8,&local_8c,&local_74);
      pVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              insert(plane_surfaces_map,&local_2c8);
      pmVar1 = pmStack_58;
      local_2d8 = (_Base_ptr)pVar8.first._M_node;
      local_2d0 = pVar8.second;
      local_74 = local_74 + 1;
      local_32c = 2 - local_5c;
      local_328 = local_5c + -1;
      local_324 = local_5c;
      local_320 = &local_32c;
      local_318 = 3;
      std::allocator<int>::allocator(&local_32d);
      __l._M_len = local_318;
      __l._M_array = local_320;
      std::vector<int,_std::allocator<int>_>::vector(&local_310,__l,&local_32d);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
                (&local_2f8,&local_74,&local_310);
      pVar7 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::insert(pmVar1,&local_2f8);
      local_340 = (_Base_ptr)pVar7.first._M_node;
      local_338 = pVar7.second;
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_2f8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_310);
      std::allocator<int>::~allocator(&local_32d);
      local_8c = local_8c + 1;
      std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_348,&local_8c,&local_74);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                (plane_surfaces_map,&local_348);
    }
    *panel_count = *panel_count + 1;
  }
  add_normal_plane(this,gain_local,depth_local,(int *)lines_map_local,
                   (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)curve_loops_map_local,pmStack_58,plane_surfaces_map,base_points_count,
                   panel_count,roof_line_vector,prev_cl_count,prev_pls_count,prev_pnt_count);
  return;
}

Assistant:

void MODEL3D::three_dim_model::add_right_plane(
int &n, int &gain, int &depth,
std::map<int, GEO::line> &lines_map,
std::map<int, std::vector<int>> &curve_loops_map,
std::map<int, int> &plane_surfaces_map,
const int &base_points_count,
int &panel_count,
std::vector<int> &roof_line_vector,
const int &prev_cl_count,
const int &prev_pls_count,
const int &prev_pnt_count)
{
    // Setting up the counter values ========================================
    int line_count = std::prev(lines_map.end(),1)->first;
    int curve_loop_count;
    if (!curve_loops_map.empty())
        curve_loop_count = std::prev(curve_loops_map.end(),1)->first;
    else
        curve_loop_count = prev_cl_count;
    int plane_surfaces_count;
    if(!plane_surfaces_map.empty())
        plane_surfaces_count = std::prev(plane_surfaces_map.end(),1)->first;
    else
        plane_surfaces_count = prev_pls_count;
    // Loop through six panels
    for ( int corner_cnt = 0; corner_cnt < 6; corner_cnt++)
    {
        // Creating the ground-level plane surface ===============================
        //c<--b
        //v + ^                             <-- Loop to form plane surface
        //d-->a
        GEO::line a, b, c, d, diag;
        a.start = n;                        // initial point of plane surface
        a.end   = base_points_count + 1 + prev_pnt_count + depth * panel_count;
        b.start = a.end;
        b.end   = b.start + depth;
        c.start = b.end;
        c.end   = a.start;
        lines_map.insert({++line_count, a});
        lines_map.insert({++line_count, b});
        lines_map.insert({++line_count, c});
        curve_loops_map.insert(
        {++curve_loop_count,
        {line_count-2, line_count-1,
        line_count} } );
        plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        // Creating the higher plane surfaces ===============================
        for ( int level_deep = 1; level_deep < depth; level_deep++)
        {
            a.start           = a.end;
            a.end          = a.end + 1;
            b.start           = a.end;
            b.end          = b.start + depth;
            c.start          = b.end;
            c.end           = c.start - 1;
            d.start          = c.end;
            d.end           = a.start;
            diag.start       = b.end;
            diag.end        = a.start;
            lines_map.insert({++line_count, a});
            lines_map.insert({++line_count, b});
            if(level_deep==(depth-1))
                roof_line_vector.push_back(line_count);
            lines_map.insert({++line_count, diag});
            lines_map.insert({++line_count, c});
            lines_map.insert({++line_count, d});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(line_count-4), (line_count-3), (line_count-2)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(-1*(line_count-2)), (line_count-1), (line_count)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        }
        panel_count++;
    }
    //treat the follow-up panel as a normal plane
    add_normal_plane(   n, gain, depth,
                        lines_map,
                        curve_loops_map,
                        plane_surfaces_map,
                        base_points_count,
                        panel_count,
                        roof_line_vector,
                        prev_cl_count,
                        prev_pls_count,
                        prev_pnt_count);
}